

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 jsonbArrayCount(JsonParse *pParse,u32 iRoot)

{
  u32 uVar1;
  u32 uVar2;
  uint uVar3;
  uint i;
  long in_FS_OFFSET;
  u32 sz;
  u32 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0xaaaaaaaa;
  uVar1 = jsonbPayloadSize(pParse,iRoot,&local_34);
  i = uVar1 + iRoot;
  uVar3 = local_34 + i;
  uVar2 = 0;
  for (; (uVar1 != 0 && (i < uVar3)); i = uVar1 + i + local_34) {
    uVar1 = jsonbPayloadSize(pParse,i,&local_34);
    uVar2 = uVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static u32 jsonbArrayCount(JsonParse *pParse, u32 iRoot){
  u32 n, sz, i, iEnd;
  u32 k = 0;
  n = jsonbPayloadSize(pParse, iRoot, &sz);
  iEnd = iRoot+n+sz;
  for(i=iRoot+n; n>0 && i<iEnd; i+=sz+n, k++){
    n = jsonbPayloadSize(pParse, i, &sz);
  }
  return k;
}